

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerMultiBr(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  MultiBranchInstr *multiBrInstr_00;
  RegOpnd *indexOpnd;
  RegOpnd *offset;
  MultiBranchInstr *multiBrInstr;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  pOVar4 = IR::Instr::GetSrc1(instr);
  if ((pOVar4 == (Opnd *)0x0) || (pOVar4 = IR::Instr::GetSrc2(instr), pOVar4 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2809,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnd on BrB");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = IR::Instr::IsBranchInstr(instr);
  if (bVar3) {
    pBVar6 = IR::Instr::AsBranchInstr(instr);
    bVar3 = IR::BranchInstr::IsMultiBranch(pBVar6);
    if (bVar3) goto LAB_007aa9d0;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x280a,"(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch())",
                     "Bad Instruction Lowering Call to LowerMultiBr()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_007aa9d0:
  pBVar6 = IR::Instr::AsBranchInstr(instr);
  multiBrInstr_00 = IR::BranchInstr::AsMultiBrInstr(pBVar6);
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  indexOpnd = IR::Opnd::AsRegOpnd(pOVar4);
  LowerJumpTableMultiBranch(this,multiBrInstr_00,indexOpnd);
  return pIVar1;
}

Assistant:

IR::Instr* Lowerer::LowerMultiBr(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnd on BrB");
    AssertMsg(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch(), "Bad Instruction Lowering Call to LowerMultiBr()");

    IR::MultiBranchInstr * multiBrInstr = instr->AsBranchInstr()->AsMultiBrInstr();
    IR::RegOpnd * offset = instr->UnlinkSrc1()->AsRegOpnd();
    LowerJumpTableMultiBranch(multiBrInstr, offset);

    return instrPrev;
}